

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_main.c
# Opt level: O0

void * getXattr(char *path,char *name,size_t *sizep)

{
  undefined8 local_30;
  ssize_t size;
  void *value;
  size_t *sizep_local;
  char *name_local;
  char *path_local;
  
  size = 0;
  local_30 = lgetxattr(path,name,(void *)0x0,0);
  if (-1 < (long)local_30) {
    size = (ssize_t)malloc(local_30);
    local_30 = lgetxattr(path,name,(void *)size,local_30);
    if ((long)local_30 < 0) {
      free((void *)size);
      size = 0;
    }
  }
  if ((long)local_30 < 0) {
    *sizep = 0;
  }
  else {
    *sizep = local_30;
  }
  return (void *)size;
}

Assistant:

void *
getXattr(const char *path, const char *name, size_t *sizep)
{
	void *value = NULL;
#if ARCHIVE_XATTR_SUPPORT
	ssize_t size;
#if ARCHIVE_XATTR_LINUX
	size = lgetxattr(path, name, NULL, 0);
#elif ARCHIVE_XATTR_DARWIN
	size = getxattr(path, name, NULL, 0, 0, XATTR_NOFOLLOW);
#elif ARCHIVE_XATTR_AIX
	size = lgetea(path, name, NULL, 0);
#elif ARCHIVE_XATTR_FREEBSD
	size = extattr_get_link(path, EXTATTR_NAMESPACE_USER, name + 5,
	    NULL, 0);
#endif

	if (size >= 0) {
		value = malloc(size);
#if ARCHIVE_XATTR_LINUX
		size = lgetxattr(path, name, value, size);
#elif ARCHIVE_XATTR_DARWIN
		size = getxattr(path, name, value, size, 0, XATTR_NOFOLLOW);
#elif ARCHIVE_XATTR_AIX
		size = lgetea(path, name, value, size);
#elif ARCHIVE_XATTR_FREEBSD
		size = extattr_get_link(path, EXTATTR_NAMESPACE_USER, name + 5,
		    value, size);
#endif
		if (size < 0) {
			free(value);
			value = NULL;
		}
	}
	if (size < 0)
		*sizep = 0;
	else
		*sizep = (size_t)size;
#else	/* !ARCHIVE_XATTR_SUPPORT */
	(void)path;	/* UNUSED */
	(void)name;	/* UNUSED */
	*sizep = 0;
#endif 	/* !ARCHIVE_XATTR_SUPPORT */
	return (value);
}